

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O2

void __thiscall randomx::JitCompilerX86::h_ISMULH_R(JitCompilerX86 *this,Instruction *instr,int i)

{
  uint8_t *puVar1;
  int iVar2;
  
  this->registerUsage[instr->dst] = i;
  puVar1 = this->code;
  iVar2 = this->codePos;
  (puVar1 + iVar2)[0] = 'I';
  (puVar1 + iVar2)[1] = 0x8b;
  iVar2 = this->codePos + 2;
  this->codePos = iVar2;
  this->code[iVar2] = instr->dst + 0xc0;
  iVar2 = this->codePos;
  this->codePos = iVar2 + 1;
  puVar1 = this->code;
  (puVar1 + (long)iVar2 + 1)[0] = 'I';
  (puVar1 + (long)iVar2 + 1)[1] = 0xf7;
  iVar2 = this->codePos + 2;
  this->codePos = iVar2;
  this->code[iVar2] = instr->src + 0xe8;
  iVar2 = this->codePos;
  this->codePos = iVar2 + 1;
  puVar1 = this->code;
  (puVar1 + (long)iVar2 + 1)[0] = 'L';
  (puVar1 + (long)iVar2 + 1)[1] = 0x8b;
  iVar2 = this->codePos + 2;
  this->codePos = iVar2;
  this->code[iVar2] = instr->dst * '\b' + 0xc2;
  this->codePos = this->codePos + 1;
  return;
}

Assistant:

void JitCompilerX86::h_ISMULH_R(Instruction& instr, int i) {
		registerUsage[instr.dst] = i;
		emit(REX_MOV_RR64);
		emitByte(0xc0 + instr.dst);
		emit(REX_MUL_R);
		emitByte(0xe8 + instr.src);
		emit(REX_MOV_R64R);
		emitByte(0xc2 + 8 * instr.dst);
	}